

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<unsigned_int>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<unsigned_int> *out)

{
  bool bVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *local_38;
  char *ptr_local;
  
  iVar3 = *(int *)&this->buffer_end_ - (int)ptr;
  local_38 = ptr;
  do {
    uVar4 = iVar3 + 0x10;
    if (size <= (int)uVar4) {
      RepeatedField<unsigned_int>::Reserve(out,out->current_size_ + (size >> 2));
      uVar4 = size & 0xfffffffc;
      puVar2 = RepeatedField<unsigned_int>::AddNAlreadyReserved(out,size >> 2);
      memcpy(puVar2,local_38,(long)(int)uVar4);
      if (size != uVar4) {
        return (char *)0x0;
      }
      return local_38 + (int)uVar4;
    }
    RepeatedField<unsigned_int>::Reserve(out,out->current_size_ + ((int)uVar4 >> 2));
    uVar5 = uVar4 & 0xfffffffc;
    puVar2 = RepeatedField<unsigned_int>::AddNAlreadyReserved(out,(int)uVar4 >> 2);
    memcpy(puVar2,local_38,(long)(int)uVar5);
    local_38 = local_38 + (int)uVar5;
    size = size - uVar5;
    bVar1 = DoneWithCheck(this,&local_38,-1);
    iVar3 = *(int *)&this->buffer_end_ - (int)local_38;
  } while (!bVar1);
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  int nbytes = buffer_end_ + kSlopBytes - ptr;
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    ptr += block_size;
    size -= block_size;
    if (DoneWithCheck(&ptr, -1)) return nullptr;
    nbytes = buffer_end_ + kSlopBytes - ptr;
  }
  int num = size / sizeof(T);
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  int block_size = num * sizeof(T);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}